

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGridPlane
          (SceneGraph *this,Vec3fa *p0,Vec3fa *dx,Vec3fa *dy,size_t width,size_t height,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  long lVar1;
  pointer *ppGVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer pvVar5;
  iterator __position;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  size_t sVar13;
  GridMeshNode *this_00;
  Vec3fa *pVVar14;
  long lVar15;
  long lVar16;
  unsigned_short uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  Grid local_74;
  long local_68;
  size_t local_60;
  pointer local_58;
  Ref<embree::SceneGraph::MaterialNode> local_50;
  Node *local_48;
  size_t local_40;
  Vec3fa *local_38;
  
  local_48 = (Node *)this;
  local_40 = width;
  this_00 = (GridMeshNode *)operator_new(0xa8);
  local_50 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_50.ptr != (MaterialNode *)0x0) {
    (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  GridMeshNode::GridMeshNode(this_00,&local_50,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  sVar13 = local_40;
  if (local_50.ptr != (MaterialNode *)0x0) {
    (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = sVar13 + 1;
  lVar15 = height + 1;
  local_60 = lVar15 * lVar1;
  uVar18 = pvVar5->size_alloced;
  uVar21 = uVar18;
  if ((uVar18 < local_60) && (uVar21 = local_60, uVar20 = uVar18, uVar18 != 0)) {
    do {
      uVar21 = uVar20 * 2 + (ulong)(uVar20 * 2 == 0);
      uVar20 = uVar21;
    } while (uVar21 < local_60);
  }
  if (local_60 < pvVar5->size_active) {
    pvVar5->size_active = local_60;
  }
  if (uVar18 == uVar21) {
    pvVar5->size_active = local_60;
  }
  else {
    local_38 = pvVar5->items;
    local_68 = lVar15;
    local_58 = pvVar5;
    pVVar14 = (Vec3fa *)alignedMalloc(uVar21 << 4,0x10);
    local_58->items = pVVar14;
    if (local_58->size_active != 0) {
      lVar15 = 0;
      uVar18 = 0;
      do {
        puVar3 = (undefined8 *)((long)&local_38->field_0 + lVar15);
        uVar12 = puVar3[1];
        puVar4 = (undefined8 *)((long)&local_58->items->field_0 + lVar15);
        *puVar4 = *puVar3;
        puVar4[1] = uVar12;
        uVar18 = uVar18 + 1;
        lVar15 = lVar15 + 0x10;
      } while (uVar18 < local_58->size_active);
    }
    alignedFree(local_38);
    local_58->size_active = local_60;
    local_58->size_alloced = uVar21;
    lVar15 = local_68;
  }
  sVar13 = local_40;
  local_74.lineStride = (int)local_40 + 1;
  uVar17 = (short)height + 1;
  local_74.startVtx = 0;
  local_74.resY = uVar17;
  local_74.resX = (unsigned_short)local_74.lineStride;
  __position._M_current =
       (this_00->grids).
       super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->grids).
      super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68 = lVar15;
    std::
    vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
    ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>
              (&this_00->grids,__position,&local_74);
    lVar15 = local_68;
  }
  else {
    (__position._M_current)->resX = (unsigned_short)local_74.lineStride;
    (__position._M_current)->resY = uVar17;
    (__position._M_current)->startVtx = (int)((ulong)local_74.lineStride << 0x20);
    (__position._M_current)->lineStride = (int)(((ulong)local_74.lineStride << 0x20) >> 0x20);
    ppGVar2 = &(this_00->grids).
               super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar2 = *ppGVar2 + 1;
  }
  lVar16 = 0;
  uVar18 = 0;
  do {
    fVar22 = (float)uVar18 / (float)height;
    uVar21 = 0;
    lVar19 = lVar16;
    do {
      fVar23 = (float)uVar21 / (float)sVar13;
      fVar6 = (dx->field_0).m128[1];
      fVar7 = (dx->field_0).m128[2];
      fVar8 = (p0->field_0).m128[1];
      fVar9 = (p0->field_0).m128[2];
      fVar10 = (dy->field_0).m128[1];
      fVar11 = (dy->field_0).m128[2];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar19) =
           (dy->field_0).m128[0] * fVar22 + fVar23 * (dx->field_0).m128[0] + (p0->field_0).m128[0];
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar19 + 4) =
           fVar10 * fVar22 + fVar23 * fVar6 + fVar8;
      *(float *)((long)&((this_00->positions).
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar19 + 8) =
           fVar11 * fVar22 + fVar23 * fVar7 + fVar9;
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar1 + (ulong)(lVar1 == 0) != uVar21);
    uVar18 = uVar18 + 1;
    lVar16 = lVar16 + sVar13 * 0x10 + 0x10;
  } while (uVar18 != lVar15 + (ulong)(lVar15 == 0));
  (local_48->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_48;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGridPlane (const Vec3fa& p0, const Vec3fa& dx, const Vec3fa& dy, size_t width, size_t height, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize((width+1)*(height+1));
    mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(0,(unsigned)width+1,(unsigned)width+1,(unsigned)height+1));

    for (size_t y=0; y<=height; y++) {
      for (size_t x=0; x<=width; x++) {
        Vec3fa p = p0+float(x)/float(width)*dx+float(y)/float(height)*dy;
        size_t i = y*(width+1)+x;
        mesh->positions[0][i].x = p.x;
        mesh->positions[0][i].y = p.y;
        mesh->positions[0][i].z = p.z;
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }